

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

QStringList *
getQtLibsFromElf(QStringList *__return_storage_ptr__,Options *options,QString *fileName)

{
  byte bVar1;
  Entry *pEVar2;
  size_t __n;
  FILE *__stream;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  QArrayData *pQVar7;
  storage_type_conflict *psVar8;
  Data *pDVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *pDVar14;
  ulong uVar15;
  ulong uVar16;
  QString *pQVar17;
  bool bVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QAnyStringView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  const_iterator cVar28;
  UP readElfCommand;
  char buffer [512];
  QStringBuilder<QLatin1String,_QString_&> local_310;
  undefined1 local_2f8 [16];
  QString *local_2e8;
  ulong local_2e0;
  QString local_2d8;
  QString local_2b8;
  QString local_298;
  QArrayData *local_278;
  QString *pQStack_270;
  storage_type_conflict *local_268;
  QArrayDataPointer<QString> local_258;
  QString local_238 [21];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_298.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_298.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_298.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  llvmReadobjPath(&local_298,options);
  cVar10 = QFile::exists(&local_298);
  if (cVar10 == '\0') {
    getQtLibsFromElf();
  }
  else {
    shellQuote(&local_2d8,&local_298);
    shellQuote((QString *)(local_2f8 + 8),fileName);
    local_258.size = local_2d8.d.size | 0x8000000000000000;
    local_238[0].d.d = (Data *)&local_258;
    local_258.d = (Data *)CONCAT71(local_258.d._1_7_,1);
    local_258.ptr = (QString *)local_2d8.d.ptr;
    local_268 = (storage_type_conflict *)(local_2e0 | 0x8000000000000000);
    local_238[0].d.ptr = (char16_t *)&local_278;
    local_278 = (QArrayData *)CONCAT71(local_278._1_7_,1);
    pQStack_270 = local_2e8;
    local_238[0].d.size = 0;
    QVar20.m_size = (size_t)"%1 --needed-libs %2";
    QVar20.field_0.m_data = &local_2b8;
    QtPrivate::argToQString(QVar20,0x4000000000000013,(ArgBase **)0x2);
    pcVar6 = local_298.d.ptr;
    pDVar5 = local_298.d.d;
    qVar4 = local_2b8.d.size;
    pDVar3 = local_2b8.d.d;
    local_2b8.d.d = local_298.d.d;
    local_298.d.d = pDVar3;
    local_298.d.ptr = local_2b8.d.ptr;
    local_2b8.d.ptr = pcVar6;
    local_2b8.d.size = local_298.d.size;
    local_298.d.size = qVar4;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_2f8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_2f8._8_8_,2,0x10);
      }
    }
    if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_2f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    openProcess((QString *)local_2f8);
    if ((FILE *)local_2f8._0_8_ == (FILE *)0x0) {
      getQtLibsFromElf();
    }
    else {
      local_258.d = (Data *)0x0;
      local_258.ptr = (QString *)0x0;
      local_258.size = 0;
      memset(local_238,0xaa,0x200);
      pcVar13 = fgets((char *)local_238,0x200,(FILE *)local_2f8._0_8_);
      if (pcVar13 != (char *)0x0) {
        uVar12 = 0;
        do {
          local_268 = &DAT_aaaaaaaaaaaaaaaa;
          local_278 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          pQStack_270 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          local_268 = (storage_type_conflict *)strlen((char *)local_238);
          local_278 = (QArrayData *)0x0;
          local_2b8.d.d = (Data *)0x0;
          local_2b8.d.ptr = (char16_t *)0x0;
          local_2b8.d.size = 0;
          pQStack_270 = local_238;
          QByteArray::trimmed_helper((QByteArray *)&local_2d8);
          pQVar17 = pQStack_270;
          pQVar7 = local_278;
          qVar4 = local_2d8.d.size;
          pDVar3 = local_2d8.d.d;
          local_2d8.d.d = (Data *)local_278;
          local_278 = &pDVar3->super_QArrayData;
          pQStack_270 = (QString *)local_2d8.d.ptr;
          local_2d8.d.ptr = (char16_t *)pQVar17;
          local_2d8.d.size = (qsizetype)local_268;
          local_268 = (storage_type_conflict *)qVar4;
          if (pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar7,1,0x10);
            }
          }
          psVar8 = local_268;
          if ((uVar12 & 1) == 0) {
            QVar23.m_data = (storage_type_conflict *)pQStack_270;
            QVar23.m_size = (qsizetype)local_268;
            QVar26.m_data = "Arch: ";
            QVar26.m_size = 6;
            cVar10 = QtPrivate::startsWith(QVar23,QVar26);
            if (cVar10 != '\0') {
              QByteArray::mid((longlong)&local_2d8,(longlong)&local_278);
              cVar28 = QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                                 (&elfArchitectures,(QByteArray *)&local_2d8);
              uVar16 = cVar28.i.bucket;
              pDVar14 = cVar28.i.d;
              if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,1,0x10);
                }
              }
              bVar19 = true;
              if (pDVar14 != (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 || uVar16 != 0
                 ) {
                pEVar2 = pDVar14->spans[uVar16 >> 7].entries;
                bVar1 = pDVar14->spans[uVar16 >> 7].offsets[(uint)cVar28.i.bucket & 0x7f];
                QString::toLatin1_helper((QString *)(local_2f8 + 8));
                uVar15 = (ulong)((uint)bVar1 * 0x30);
                __n = *(size_t *)((pEVar2->storage).data + uVar15 + 0x28);
                if (__n == local_2e0) {
                  if (__n == 0) {
                    bVar19 = false;
                  }
                  else {
                    iVar11 = bcmp(*(void **)((pEVar2->storage).data + uVar15 + 0x20),local_2e8,__n);
                    bVar19 = iVar11 != 0;
                  }
                }
              }
              if ((pDVar14 != (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 ||
                   uVar16 != 0) && ((QArrayData *)local_2f8._8_8_ != (QArrayData *)0x0)) {
                LOCK();
                (((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_2f8._8_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_2f8._8_8_,1,0x10);
                }
              }
              __stream = _stdout;
              if (bVar19) {
                if (options->verbose == true) {
                  QString::toLocal8Bit_helper((QChar *)&local_2d8,(longlong)(fileName->d).ptr);
                  pQVar17 = (QString *)local_2d8.d.ptr;
                  if ((QString *)local_2d8.d.ptr == (QString *)0x0) {
                    pQVar17 = (QString *)&QByteArray::_empty;
                  }
                  fprintf(__stream,"Skipping \"%s\", architecture mismatch\n",pQVar17);
                  if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_2d8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,1,0x10);
                    }
                  }
                }
                (__return_storage_ptr__->d).d = (Data *)0x0;
                (__return_storage_ptr__->d).ptr = (QString *)0x0;
                (__return_storage_ptr__->d).size = 0;
                bVar18 = true;
                if (bVar19) goto LAB_0011e0fd;
              }
            }
            QVar24.m_data = (storage_type_conflict *)pQStack_270;
            QVar24.m_size = (qsizetype)local_268;
            QVar27.m_data = "NeededLibraries";
            QVar27.m_size = 0xf;
            uVar12 = QtPrivate::startsWith(QVar24,QVar27);
            bVar18 = false;
          }
          else {
            QVar21.m_data = (storage_type_conflict *)pQStack_270;
            QVar21.m_size = (qsizetype)local_268;
            QVar25.m_data = "lib";
            QVar25.m_size = 3;
            cVar10 = QtPrivate::startsWith(QVar21,QVar25);
            bVar18 = false;
            if (cVar10 != '\0') {
              QVar22.m_data = psVar8;
              QVar22.m_size = (qsizetype)&local_2d8;
              QString::fromLatin1(QVar22);
              pcVar6 = local_2b8.d.ptr;
              pDVar5 = local_2b8.d.d;
              qVar4 = local_2d8.d.size;
              pDVar3 = local_2d8.d.d;
              local_2d8.d.d = local_2b8.d.d;
              local_2b8.d.d = pDVar3;
              local_2b8.d.ptr = local_2d8.d.ptr;
              local_2d8.d.ptr = pcVar6;
              local_2d8.d.size = local_2b8.d.size;
              local_2b8.d.size = qVar4;
              if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                }
              }
              local_2d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_2d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_2d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              local_310.a.m_size = (qsizetype)&DAT_00000004;
              local_310.a.m_data = "lib/";
              local_310.b = &local_2b8;
              QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>(&local_2d8,&local_310);
              absoluteFilePath((QString *)&local_310,options,&local_2d8);
              cVar10 = QFile::exists((QString *)&local_310);
              if ((QArrayData *)local_310.a.m_size != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_310.a.m_size)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_310.a.m_size)->_q_value).super___atomic_base<int>.
                     _M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_310.a.m_size)->_q_value).super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_310.a.m_size,2,0x10);
                }
              }
              if (cVar10 != '\0') {
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)&local_258,local_258.size,&local_2d8);
                QList<QString>::end((QList<QString> *)&local_258);
              }
              if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
                }
              }
              bVar18 = false;
            }
          }
LAB_0011e0fd:
          if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_278 != (QArrayData *)0x0) {
            LOCK();
            (local_278->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_278->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_278->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_278,1,0x10);
            }
          }
          if (bVar18) goto LAB_0011e1a3;
          pcVar13 = fgets((char *)local_238,0x200,(FILE *)local_2f8._0_8_);
        } while (pcVar13 != (char *)0x0);
      }
      qVar4 = local_258.size;
      pQVar17 = local_258.ptr;
      pDVar9 = local_258.d;
      local_258.d = (Data *)0x0;
      local_258.ptr = (QString *)0x0;
      (__return_storage_ptr__->d).d = pDVar9;
      (__return_storage_ptr__->d).ptr = pQVar17;
      local_258.size = 0;
      (__return_storage_ptr__->d).size = qVar4;
LAB_0011e1a3:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_258);
    }
    if ((FILE *)local_2f8._0_8_ != (FILE *)0x0) {
      pclose((FILE *)local_2f8._0_8_);
    }
  }
  if (&(local_298.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_298.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList getQtLibsFromElf(const Options &options, const QString &fileName)
{
    QString readElf = llvmReadobjPath(options);
    if (!QFile::exists(readElf)) {
        fprintf(stderr, "Command does not exist: %s\n", qPrintable(readElf));
        return QStringList();
    }

    readElf = "%1 --needed-libs %2"_L1.arg(shellQuote(readElf), shellQuote(fileName));

    auto readElfCommand = openProcess(readElf);
    if (!readElfCommand) {
        fprintf(stderr, "Cannot execute command %s\n", qPrintable(readElf));
        return QStringList();
    }

    QStringList ret;

    bool readLibs = false;
    char buffer[512];
    while (fgets(buffer, sizeof(buffer), readElfCommand.get()) != nullptr) {
        QByteArray line = QByteArray::fromRawData(buffer, qstrlen(buffer));
        QString library;
        line = line.trimmed();
        if (!readLibs) {
            if (line.startsWith("Arch: ")) {
                auto it = elfArchitectures.find(line.mid(6));
                if (it == elfArchitectures.constEnd() || *it != options.currentArchitecture.toLatin1()) {
                    if (options.verbose)
                        fprintf(stdout, "Skipping \"%s\", architecture mismatch\n", qPrintable(fileName));
                    return {};
                }
            }
            readLibs = line.startsWith("NeededLibraries");
            continue;
        }
        if (!line.startsWith("lib"))
            continue;
        library = QString::fromLatin1(line);
        QString libraryName = "lib/"_L1 + library;
        if (QFile::exists(absoluteFilePath(&options, libraryName)))
            ret += libraryName;
    }

    return ret;
}